

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder *
capnp::_::OrphanBuilder::initList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,ElementSize elementSize)

{
  WirePointer *ref;
  word *pwVar1;
  undefined1 local_50 [8];
  ListBuilder builder;
  ElementSize elementSize_local;
  ElementCount elementCount_local;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  OrphanBuilder *result;
  
  builder.structDataSize._2_1_ = 0;
  builder.structDataSize._3_1_ = elementSize;
  builder._36_4_ = elementCount;
  OrphanBuilder(__return_storage_ptr__);
  ref = tagAsPtr(__return_storage_ptr__);
  WireHelpers::initListPointer
            ((ListBuilder *)local_50,ref,(SegmentBuilder *)0x0,capTable,builder._36_4_,
             builder.structDataSize._3_1_,arena);
  __return_storage_ptr__->segment = (SegmentBuilder *)local_50;
  __return_storage_ptr__->capTable = capTable;
  pwVar1 = ListBuilder::getLocation((ListBuilder *)local_50);
  __return_storage_ptr__->location = pwVar1;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, ElementSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}